

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O1

int Gia_ManCombMarkUsed(Gia_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar8 = p->nObjs;
  if ((0 < (int)uVar8) && (pGVar7 = p->pObjs, pGVar7 != (Gia_Obj_t *)0x0)) {
    lVar4 = 0;
    do {
      uVar1 = *(ulong *)pGVar7;
      uVar8 = (uint)uVar1;
      if ((~uVar8 & 0x1fffffff) == 0 || (int)uVar8 < 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)((uint)((uVar8 & 0x1fffffff) != ((uint)(uVar1 >> 0x20) & 0x1fffffff)) << 0x1e
                       );
        if ((uVar8 & 0x1fffffff) == 0x1fffffff) {
          uVar9 = 0x40000000;
        }
      }
      *(ulong *)pGVar7 = uVar1 & 0xffffffffbfffffff | uVar9;
      lVar4 = lVar4 + 1;
      uVar8 = p->nObjs;
    } while ((lVar4 < (int)uVar8) && (pGVar7 = p->pObjs + lVar4, p->pObjs != (Gia_Obj_t *)0x0));
  }
  iVar6 = 0;
  if (p->nBufs != 0) {
    uVar8 = 0;
  }
  if ((int)uVar8 < p->nObjs) {
    lVar4 = (ulong)uVar8 * 0xc;
    uVar10 = uVar8;
    do {
      if ((int)uVar8 < 0) goto LAB_00224852;
      pGVar7 = p->pObjs;
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      uVar2 = (uint)*(undefined8 *)(&pGVar7->field_0x0 + lVar4);
      if (((-1 < (int)uVar2) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar2 & 0x1fffffff) ==
          ((uint)((ulong)*(undefined8 *)(&pGVar7->field_0x0 + lVar4) >> 0x20) & 0x1fffffff))) {
        iVar3 = Gia_ManCombMarkUsed_rec
                          (p,(Gia_Obj_t *)
                             ((long)pGVar7 + lVar4 + (ulong)((uVar2 & 0x1fffffff) << 2) * -3));
        iVar6 = iVar6 + iVar3;
      }
      lVar4 = lVar4 + 0xc;
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < p->nObjs);
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      iVar3 = pVVar5->pArray[lVar4];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_00224852:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return iVar6;
      }
      pGVar7 = p->pObjs + iVar3;
      iVar3 = Gia_ManCombMarkUsed_rec(p,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff))
      ;
      iVar6 = iVar6 + iVar3;
      lVar4 = lVar4 + 1;
      pVVar5 = p->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  return iVar6;
}

Assistant:

int Gia_ManCombMarkUsed( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = Gia_ObjIsAnd(pObj) && !Gia_ObjIsBuf(pObj);
    Gia_ManForEachBuf( p, pObj, i )
        nNodes += Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        nNodes += Gia_ManCombMarkUsed_rec( p, Gia_ObjFanin0(pObj) );
    return nNodes;
}